

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::ResourceDataValue::getStringOrFirstOfArray
          (UnicodeString *__return_storage_ptr__,ResourceDataValue *this,UErrorCode *errorCode)

{
  ResourceData *pResData;
  uint uVar1;
  Resource res;
  int32_t sLength;
  ResourceArray array;
  int32_t local_64;
  ConstChar16Ptr local_60;
  ConstChar16Ptr local_58 [5];
  ushort *local_30;
  Resource *local_28;
  int local_20;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003c0258;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    local_58[0].p_ = res_getString_63(this->pResData,this->res,&local_64);
    if (local_58[0].p_ == (UChar *)0x0) {
      (*(this->super_ResourceValue).super_UObject._vptr_UObject[10])(&local_30,this,errorCode);
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        if (0 < local_20) {
          pResData = this->pResData;
          if (local_30 == (ushort *)0x0) {
            res = *local_28;
          }
          else {
            uVar1 = (uint)*local_30;
            if (pResData->poolStringIndex16Limit <= (int)uVar1) {
              uVar1 = (uVar1 - pResData->poolStringIndex16Limit) + pResData->poolStringIndexLimit;
            }
            res = uVar1 | 0x60000000;
          }
          local_60.p_ = res_getString_63(pResData,res,&local_64);
          if (local_60.p_ != (UChar *)0x0) {
            UnicodeString::setTo(__return_storage_ptr__,'\x01',&local_60,local_64);
            return __return_storage_ptr__;
          }
        }
        *errorCode = U_RESOURCE_TYPE_MISMATCH;
      }
    }
    else {
      UnicodeString::setTo(__return_storage_ptr__,'\x01',local_58,local_64);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString ResourceDataValue::getStringOrFirstOfArray(UErrorCode &errorCode) const {
    UnicodeString us;
    if(U_FAILURE(errorCode)) {
        return us;
    }
    int32_t sLength;
    const UChar *s = res_getString(pResData, res, &sLength);
    if(s != NULL) {
        us.setTo(TRUE, s, sLength);
        return us;
    }
    ResourceArray array = getArray(errorCode);
    if(U_FAILURE(errorCode)) {
        return us;
    }
    if(array.getSize() > 0) {
        s = res_getString(pResData, array.internalGetResource(pResData, 0), &sLength);
        if(s != NULL) {
            us.setTo(TRUE, s, sLength);
            return us;
        }
    }
    errorCode = U_RESOURCE_TYPE_MISMATCH;
    return us;
}